

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pd~.c
# Opt level: O2

void pd_tilde_pdtilde(t_pd_tilde *x,t_symbol *s,int argc,t_atom *argv)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  __pid_t _Var7;
  t_symbol *ptVar8;
  t_symbol *ptVar9;
  t_symbol *ptVar10;
  size_t sVar11;
  char *pcVar12;
  FILE *__stream;
  FILE *infd;
  char *pcVar13;
  ulong uVar14;
  long lVar15;
  char **ppcVar16;
  uint local_189c;
  int pipe2 [2];
  int pipe1 [2];
  char noutsigstr [20];
  char ninsigstr [20];
  char sampleratestr [40];
  stat local_17f8;
  char *execargv [114];
  char tmpbuf [1000];
  char pdexecbuf [1000];
  char scheddirstring [1000];
  char schedbuf [1000];
  char patchdir [1000];
  
  if ((argc < 1) || (argv->a_type != A_SYMBOL)) {
    ptVar9 = gensym("?");
  }
  else {
    ptVar9 = (argv->a_w).w_symbol;
  }
  ptVar8 = gensym("start");
  if (ptVar9 != ptVar8) {
    ptVar8 = gensym("stop");
    if (ptVar9 == ptVar8) {
      if (x->x_infd == (FILE *)0x0) {
        return;
      }
      pd_tilde_close(x);
      return;
    }
    ptVar8 = gensym("pddir");
    if (ptVar9 == ptVar8) {
      if ((1 < argc) && (argv[1].a_type == A_SYMBOL)) {
        x->x_pddir = (t_symbol *)argv[1].a_w;
        return;
      }
      pd_error(x,"pd~ pddir: needs symbol argument");
      return;
    }
    pd_error(x,"pd~: unknown control message: %s",ptVar9->s_name);
    return;
  }
  if (x->x_infd != (FILE *)0x0) {
    pd_tilde_close(x);
  }
  ptVar9 = canvas_getdir(x->x_canvas);
  pcVar12 = ptVar9->s_name;
  ptVar9 = x->x_schedlibdir;
  ptVar8 = gensym(".");
  if ((ptVar9 == ptVar8) && (ptVar8 = x->x_pddir, ptVar10 = gensym("."), ptVar8 != ptVar10)) {
    pcVar4 = x->x_pddir->s_name;
    sVar11 = strlen(pcVar4);
    if ((int)(uint)sVar11 < 4) {
LAB_0019f758:
      pcVar13 = "%s/extra/pd~";
    }
    else {
      uVar14 = (ulong)((uint)sVar11 & 0x7fffffff);
      iVar5 = strcmp(pcVar4 + (uVar14 - 3),"bin");
      pcVar13 = "%s/../extra/pd~";
      if ((iVar5 != 0) && (iVar5 = strcmp(pcVar4 + (uVar14 - 4),"bin/"), iVar5 != 0))
      goto LAB_0019f758;
    }
    snprintf(scheddirstring,1000,pcVar13,pcVar4);
    ptVar9 = gensym(scheddirstring);
  }
  pcVar4 = x->x_pddir->s_name;
  pcVar13 = ptVar9->s_name;
  uVar2 = x->x_ninsig;
  uVar3 = x->x_noutsig;
  iVar5 = x->x_fifo;
  fVar1 = x->x_sr;
  x->x_childpid = -1;
  if (argc < 0x66) {
    local_189c = argc - 1;
  }
  else {
    local_189c = 100;
    post("pd~: args truncated to %d items");
  }
  sprintf(ninsigstr,"%d",(ulong)uVar2);
  sprintf(noutsigstr,"%d",(ulong)uVar3);
  sprintf(sampleratestr,"%f",SUB84((double)fVar1,0));
  snprintf(tmpbuf,1000,"%s/bin/pd",pcVar4);
  sys_bashfilename(tmpbuf,pdexecbuf);
  iVar6 = stat(pdexecbuf,&local_17f8);
  if (iVar6 < 0) {
    snprintf(tmpbuf,1000,"%s/../../../bin/pd",pcVar4);
    sys_bashfilename(tmpbuf,pdexecbuf);
    iVar6 = stat(pdexecbuf,&local_17f8);
    if (iVar6 < 0) {
      snprintf(tmpbuf,1000,"%s/pd",pcVar4);
      sys_bashfilename(tmpbuf,pdexecbuf);
      iVar6 = stat(pdexecbuf,&local_17f8);
      if (iVar6 < 0) {
        pcVar12 = pdexecbuf;
LAB_0019fb64:
        pd_error(x,"pd~: can\'t stat %s",pcVar12);
        goto LAB_0019fd62;
      }
    }
  }
  ppcVar16 = pd_tilde_dllextent;
  do {
    if (*ppcVar16 == (char *)0x0) {
      pcVar12 = schedbuf;
      goto LAB_0019fb64;
    }
    snprintf(tmpbuf,1000,"%s/pdsched%s",pcVar13);
    sys_bashfilename(tmpbuf,schedbuf);
    iVar6 = stat(schedbuf,&local_17f8);
    ppcVar16 = ppcVar16 + 1;
  } while (iVar6 < 0);
  snprintf(tmpbuf,1000,"%s/pdsched",pcVar13);
  sys_bashfilename(tmpbuf,schedbuf);
  snprintf(scheddirstring,1000,"%s",pdexecbuf);
  snprintf(patchdir,1000,"%s",pcVar12);
  execargv[1] = "-schedlib";
  execargv[3] = "-extraflags";
  execargv[4] = "b";
  if (x->x_binary == 0) {
    execargv[4] = "a";
  }
  execargv[5] = "-path";
  execargv[7] = "-inchannels";
  execargv[8] = ninsigstr;
  execargv[9] = "-outchannels";
  execargv[10] = noutsigstr;
  execargv[0xb] = "-r";
  uVar14 = 0;
  if (0 < (int)local_189c) {
    uVar14 = (ulong)local_189c;
  }
  execargv[0xc] = sampleratestr;
  execargv[0] = pdexecbuf;
  execargv[2] = schedbuf;
  execargv[6] = patchdir;
  for (lVar15 = 0; uVar14 * 8 != lVar15; lVar15 = lVar15 + 8) {
    iVar6 = *(int *)((long)&argv[1].a_type + lVar15 * 2);
    if (iVar6 == 1) {
      sprintf(tmpbuf,"%f",SUB84((double)*(float *)((long)&argv[1].a_w + lVar15 * 2),0));
    }
    else if (iVar6 == 2) {
      snprintf(tmpbuf,1000,"%s",**(undefined8 **)((long)&argv[1].a_w + lVar15 * 2));
    }
    sVar11 = strlen(tmpbuf);
    pcVar12 = (char *)malloc(sVar11 + 1);
    *(char **)((long)execargv + lVar15 + 0x68) = pcVar12;
    strcpy(pcVar12,tmpbuf);
  }
  execargv[(long)(int)local_189c + 0xd] = (char *)0x0;
  iVar6 = pipe(pipe1);
  if (iVar6 < 0) {
    pd_error(x,"pd~: can\'t create pipe");
  }
  else {
    iVar6 = pipe(pipe2);
    if (iVar6 < 0) {
      pd_error(x,"pd~: can\'t create pipe");
    }
    else {
      _Var7 = fork();
      if (-1 < _Var7) {
        if (_Var7 != 0) {
          for (ppcVar16 = execargv + 0xd; *ppcVar16 != (char *)0x0; ppcVar16 = ppcVar16 + 1) {
            free(*ppcVar16);
          }
          close(pipe1[0]);
          close(pipe2[1]);
          fcntl(pipe1[1],2,1);
          fcntl(pipe2[0],2,1);
          __stream = fdopen(pipe1[1],"w");
          infd = fdopen(pipe2[0],"r");
          x->x_childpid = _Var7;
          iVar6 = 0;
          if (0 < iVar5) {
            iVar6 = iVar5;
          }
          while (iVar6 != 0) {
            if (x->x_binary == 0) {
              fputs(";\n0;\n",__stream);
              iVar6 = iVar6 + -1;
            }
            else {
              pd_tilde_putsemi((FILE *)__stream);
              pd_tilde_putfloat(0.0,(FILE *)__stream);
              pd_tilde_putsemi((FILE *)__stream);
              iVar6 = iVar6 + -1;
            }
          }
          fflush(__stream);
          binbuf_clear(x->x_binbuf);
          pd_tilde_readmessages(x,(FILE *)infd);
          x->x_outfd = (FILE *)__stream;
          x->x_infd = (FILE *)infd;
          return;
        }
        if (pipe2[1] == 0) {
          pipe2[1] = dup(0);
        }
        if (pipe1[0] != 0) {
          dup2(pipe1[0],0);
          close(pipe1[0]);
        }
        if (pipe2[1] != 1) {
          dup2(pipe2[1],1);
          close(pipe2[1]);
        }
        if (1 < pipe1[1]) {
          close(pipe1[1]);
        }
        if (1 < pipe2[0]) {
          close(pipe2[0]);
        }
        execv(scheddirstring,execargv);
        _exit(1);
      }
      pd_error(x,"pd~: can\'t fork");
      close(pipe2[0]);
      close(pipe2[1]);
      if (0 < x->x_childpid) {
        waitpid(x->x_childpid,(int *)0x0,0);
      }
    }
    close(pipe1[0]);
    close(pipe1[1]);
  }
LAB_0019fd62:
  x->x_infd = (FILE *)0x0;
  x->x_outfd = (FILE *)0x0;
  x->x_childpid = -1;
  post("pd~ startup failed");
  return;
}

Assistant:

static void pd_tilde_pdtilde(t_pd_tilde *x, t_symbol *s,
    int argc, t_atom *argv)
{
    t_symbol *sel = ((argc > 0 && argv->a_type == A_SYMBOL) ?
        argv->a_w.w_symbol : gensym("?")), *schedlibdir;
    const char *patchdir;

    if (sel == gensym("start"))
    {
        char pdargstring[MAXPDSTRING];
#ifdef MAX
    critical_enter(0);
#endif
        if (x->x_infd)
            pd_tilde_close(x);
#ifdef MAX
    critical_exit(0);
#endif
        pdargstring[0] = 0;
        argc--; argv++;
#ifdef PD
        patchdir = canvas_getdir(x->x_canvas)->s_name;
#endif
#ifdef MSP
        patchdir = ".";
#endif
        schedlibdir = x->x_schedlibdir;
        if (schedlibdir == gensym(".") && x->x_pddir != gensym("."))
        {
            const char *pds = x->x_pddir->s_name;
            char scheddirstring[MAXPDSTRING];
            int l = strlen(pds);
            if (l >= 4 && (!strcmp(pds+l-3, "bin") || !strcmp(pds+l-4, "bin/")))
                snprintf(scheddirstring, MAXPDSTRING, "%s/../extra/pd~", pds);
            else snprintf(scheddirstring, MAXPDSTRING, "%s/extra/pd~", pds);
            schedlibdir = gensym(scheddirstring);
        }
        pd_tilde_dostart(x, x->x_pddir->s_name, schedlibdir->s_name,
            patchdir, argc, argv, x->x_ninsig, x->x_noutsig, x->x_fifo,
                x->x_sr);
    }
    else if (sel == gensym("stop"))
    {
#ifdef MAX
    critical_enter(0);
#endif
        if (x->x_infd)
            pd_tilde_close(x);
#ifdef MAX
    critical_exit(0);
#endif
    }
    else if (sel == gensym("pddir"))
    {
        if ((argc > 1) && argv[1].a_type == A_SYMBOL)
        {
            t_symbol *sym = argv[1].a_w.w_symbol;
#ifdef MSP
            if (sym->s_name[0] == ':')
                sym = gensym(s->s_name+1);
#endif
            x->x_pddir = sym;
        }
        else PDERROR "pd~ pddir: needs symbol argument");
    }
    else PDERROR "pd~: unknown control message: %s", sel->s_name);
}